

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

void rouse_shk(monst *shkp,boolean verbosely)

{
  boolean bVar1;
  uint uVar2;
  int iVar3;
  obj *poVar4;
  char *pcVar5;
  char *pcVar6;
  
  uVar2 = *(uint *)&shkp->field_0x60;
  if ((uVar2 & 0xc0000) == 0x40000) {
    return;
  }
  if (verbosely == '\0') goto LAB_0022d0fc;
  if (shkp->wormno == '\0') {
    if ((viz_array[shkp->my][shkp->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0022ced4;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0022cecb;
      }
      else {
LAB_0022cecb:
        if (ublindf == (obj *)0x0) goto LAB_0022cf7e;
LAB_0022ced4:
        if (ublindf->oartifact != '\x1d') goto LAB_0022cf7e;
      }
      if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) || ((viz_array[shkp->my][shkp->mx] & 1U) == 0)
          ) || ((shkp->data->mflags3 & 0x200) == 0)) goto LAB_0022cf7e;
    }
LAB_0022cf31:
    if ((((uVar2 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)) {
      if (((uVar2 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_0022cf71;
      goto LAB_0022cf7e;
    }
    if ((uVar2 & 0x280) != 0) goto LAB_0022cf7e;
LAB_0022cf71:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_0022cf7e;
  }
  else {
    bVar1 = worm_known(level,shkp);
    if (bVar1 != '\0') {
      uVar2 = *(uint *)&shkp->field_0x60;
      goto LAB_0022cf31;
    }
LAB_0022cf7e:
    if (((shkp->data->mflags1 & 0x10000) == 0) &&
       ((poVar4 = which_armor(shkp,4), poVar4 == (obj *)0x0 ||
        (poVar4 = which_armor(shkp,4), poVar4->otyp != 0x4f)))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0022cfd2;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0022cfcd;
      }
      else {
LAB_0022cfcd:
        if (ublindf != (obj *)0x0) {
LAB_0022cfd2:
          if (ublindf->oartifact == '\x1d') goto LAB_0022d065;
        }
        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_0022d0cc;
      }
LAB_0022d065:
      if ((u.uprops[0x19].extrinsic != 0) &&
         ((u.uprops[0x19].blocked == 0 &&
          (iVar3 = dist2((int)shkp->mx,(int)shkp->my,(int)u.ux,(int)u.uy), iVar3 < 0x41))))
      goto LAB_0022d0cc;
    }
    if ((u.uprops[0x42].intrinsic == 0) &&
       ((u.uprops[0x42].extrinsic == 0 && (bVar1 = match_warn_of_mon(shkp), bVar1 == '\0'))))
    goto LAB_0022d0fc;
  }
LAB_0022d0cc:
  pcVar5 = Monnam(shkp);
  pcVar6 = "wakes up";
  if ((*(uint *)&shkp->field_0x60 >> 0x13 & 1) == 0) {
    pcVar6 = "can move again";
  }
  pline("%s %s.",pcVar5,pcVar6);
LAB_0022d0fc:
  shkp->mfrozen = '\0';
  *(uint *)&shkp->field_0x60 = *(uint *)&shkp->field_0x60 & 0xfff3ffff | 0x40000;
  return;
}

Assistant:

static void rouse_shk(struct monst *shkp, boolean verbosely)
{
	if (!shkp->mcanmove || shkp->msleeping) {
	    /* greed induced recovery... */
	    if (verbosely && canspotmon(level, shkp))
		pline("%s %s.", Monnam(shkp),
		      shkp->msleeping ? "wakes up" : "can move again");
	    shkp->msleeping = 0;
	    shkp->mfrozen = 0;
	    shkp->mcanmove = 1;
	}
}